

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_shader_module
          (Impl *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob,
          ScratchAllocator *blob_allocator)

{
  pointer __dest;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t size;
  uint8_t *buffer;
  Ch *__src;
  Value serialized_shader_modules;
  Value varint;
  Data local_148;
  undefined1 local_138 [16];
  CrtAllocator *pCStack_128;
  char *local_120;
  char *pcStack_118;
  char *local_110;
  size_t local_108;
  int local_100;
  bool local_fc;
  Data local_f8;
  long local_e8;
  long lStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  Data local_c8;
  StringRefType local_b8;
  StringRefType local_a8;
  Data local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_88;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_80;
  Stack<rapidjson::CrtAllocator> local_78;
  undefined4 local_48;
  undefined8 local_40;
  
  local_78.stack_ = (char *)0x0;
  local_78.stackTop_ = (char *)0x0;
  local_78.allocator_ = (CrtAllocator *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  local_88 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_80 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x0;
  local_78.stackEnd_ = (char *)0x0;
  local_78.initialCapacity_ = 0x400;
  local_48 = 0;
  local_40 = 0;
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  allocator->chunkHead_ = (ChunkHeader *)0x0;
  allocator->chunk_capacity_ = 0x10000;
  allocator->userBuffer_ = (void *)0x0;
  allocator->baseAllocator_ = (CrtAllocator *)0x0;
  allocator->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_98.n = (Number)0x0;
  local_98.s.str = (Ch *)0x3000000000000;
  local_148.n = (Number)0x0;
  local_148.s.str = (Ch *)0x3000000000000;
  local_88 = allocator;
  pMStack_80 = allocator;
  size = compute_size_varint(create_info->pCode,create_info->codeSize >> 2);
  buffer = (uint8_t *)ScratchAllocator::allocate_raw(blob_allocator,size,0x40);
  encode_varint(buffer,create_info->pCode,create_info->codeSize >> 2);
  local_c8.n = (Number)0x0;
  local_c8.s.str = (Ch *)0x3000000000000;
  local_f8.s.str = (Ch *)0x405000000150bf6;
  local_f8.n = (Number)0xc;
  local_138._0_8_ = (Number)0x0;
  local_138._8_8_ = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_f8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_138,allocator);
  local_a8.s = "varintSize";
  local_a8.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_a8,size,allocator);
  local_b8.s = "codeSize";
  local_b8.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_c8.s,&local_b8,create_info->codeSize,allocator);
  local_f8.s.str = (Ch *)0x405000000150be7;
  local_f8.n = (Number)0x5;
  local_138._0_8_ = (Number)0x0;
  local_138._8_8_ = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_f8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_138,allocator);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)local_138,hash,allocator);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_138,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,allocator);
  local_f8.s.str = (Ch *)0x405000000151c7d;
  local_f8.n = (Number)0x7;
  local_138._0_8_ = (Number)0x6;
  local_138._8_8_ = (Ch *)0x1f6000000000000;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_f8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_138,allocator);
  local_138._8_8_ = (Ch *)0x405000000151cdb;
  local_138._0_8_ = (Number)0xd;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_138,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_148.s,allocator);
  local_d8 = 0;
  local_e8 = 0;
  lStack_e0 = 0;
  local_f8.n = (Number)0x0;
  local_f8.s.str = (Ch *)0x0;
  local_d0 = 0x100;
  local_138._8_8_ = (Ch *)0x0;
  pCStack_128 = (CrtAllocator *)0x0;
  local_120 = (char *)0x0;
  pcStack_118 = (char *)0x0;
  local_110 = (char *)0x0;
  local_108 = 0x200;
  local_100 = 0x144;
  local_fc = false;
  local_138._0_8_ = &local_f8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_98.s,
             (Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *)local_138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (blob,((lStack_e0 + size) - local_e8) + 1);
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_f8.s);
  memcpy(__dest,__src,lStack_e0 - local_e8);
  (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start[lStack_e0 - local_e8] = '\0';
  memcpy((blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + (lStack_e0 - local_e8) + 1,buffer,size);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)(local_138 + 8));
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy
            ((Stack<rapidjson::CrtAllocator> *)&local_f8.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_98.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  return true;
}

Assistant:

bool StateRecorder::Impl::serialize_shader_module(Hash hash, const VkShaderModuleCreateInfo &create_info,
                                                  vector<uint8_t> &blob, ScratchAllocator &blob_allocator) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value serialized_shader_modules(kObjectType);

	size_t size = compute_size_varint(create_info.pCode, create_info.codeSize / 4);
	uint8_t *encoded = static_cast<uint8_t *>(blob_allocator.allocate_raw(size, 64));
	encode_varint(encoded, create_info.pCode, create_info.codeSize / 4);

	Value varint(kObjectType);
	varint.AddMember("varintOffset", 0, alloc);
	varint.AddMember("varintSize", uint64_t(size), alloc);
	varint.AddMember("codeSize", uint64_t(create_info.codeSize), alloc);
	varint.AddMember("flags", 0, alloc);

	// Varint binary form, starts at offset 0 after the delim '\0' character.
	serialized_shader_modules.AddMember(uint64_string(hash, alloc), varint, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("shaderModules", serialized_shader_modules, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize() + 1 + size);
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	blob[buffer.GetSize()] = '\0';
	memcpy(blob.data() + buffer.GetSize() + 1, encoded, size);
	return true;
}